

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KeyHashingShardedKVS.hpp
# Opt level: O2

void __thiscall
supermap::
KeyHashingShardedKVS<supermap::Key<30UL>,_supermap::MaybeRemovedValue<supermap::ByteArray<100UL>_>,_unsigned_long>
::add(KeyHashingShardedKVS<supermap::Key<30UL>,_supermap::MaybeRemovedValue<supermap::ByteArray<100UL>_>,_unsigned_long>
      *this,Key<30UL> *key,MaybeRemovedValue<supermap::ByteArray<100UL>_> *value)

{
  __uniq_ptr_impl<supermap::KeyValueStorage<supermap::Key<30UL>,_supermap::MaybeRemovedValue<supermap::ByteArray<100UL>_>,_unsigned_long>,_std::default_delete<supermap::KeyValueStorage<supermap::Key<30UL>,_supermap::MaybeRemovedValue<supermap::ByteArray<100UL>_>,_unsigned_long>_>_>
  _Var1;
  size_t sVar2;
  
  sVar2 = getShardIdForKey(this,key);
  _Var1._M_t.
  super__Tuple_impl<0UL,_supermap::KeyValueStorage<supermap::Key<30UL>,_supermap::MaybeRemovedValue<supermap::ByteArray<100UL>_>,_unsigned_long>_*,_std::default_delete<supermap::KeyValueStorage<supermap::Key<30UL>,_supermap::MaybeRemovedValue<supermap::ByteArray<100UL>_>,_unsigned_long>_>_>
  .
  super__Head_base<0UL,_supermap::KeyValueStorage<supermap::Key<30UL>,_supermap::MaybeRemovedValue<supermap::ByteArray<100UL>_>,_unsigned_long>_*,_false>
  ._M_head_impl =
       (this->nestedStorages_).
       super__Vector_base<std::unique_ptr<supermap::KeyValueStorage<supermap::Key<30UL>,_supermap::MaybeRemovedValue<supermap::ByteArray<100UL>_>,_unsigned_long>,_std::default_delete<supermap::KeyValueStorage<supermap::Key<30UL>,_supermap::MaybeRemovedValue<supermap::ByteArray<100UL>_>,_unsigned_long>_>_>,_std::allocator<std::unique_ptr<supermap::KeyValueStorage<supermap::Key<30UL>,_supermap::MaybeRemovedValue<supermap::ByteArray<100UL>_>,_unsigned_long>,_std::default_delete<supermap::KeyValueStorage<supermap::Key<30UL>,_supermap::MaybeRemovedValue<supermap::ByteArray<100UL>_>,_unsigned_long>_>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start[sVar2]._M_t.
       super___uniq_ptr_impl<supermap::KeyValueStorage<supermap::Key<30UL>,_supermap::MaybeRemovedValue<supermap::ByteArray<100UL>_>,_unsigned_long>,_std::default_delete<supermap::KeyValueStorage<supermap::Key<30UL>,_supermap::MaybeRemovedValue<supermap::ByteArray<100UL>_>,_unsigned_long>_>_>
       ._M_t;
  (*(code *)**(undefined8 **)
              _Var1._M_t.
              super__Tuple_impl<0UL,_supermap::KeyValueStorage<supermap::Key<30UL>,_supermap::MaybeRemovedValue<supermap::ByteArray<100UL>_>,_unsigned_long>_*,_std::default_delete<supermap::KeyValueStorage<supermap::Key<30UL>,_supermap::MaybeRemovedValue<supermap::ByteArray<100UL>_>,_unsigned_long>_>_>
              .
              super__Head_base<0UL,_supermap::KeyValueStorage<supermap::Key<30UL>,_supermap::MaybeRemovedValue<supermap::ByteArray<100UL>_>,_unsigned_long>_*,_false>
              ._M_head_impl)
            (_Var1._M_t.
             super__Tuple_impl<0UL,_supermap::KeyValueStorage<supermap::Key<30UL>,_supermap::MaybeRemovedValue<supermap::ByteArray<100UL>_>,_unsigned_long>_*,_std::default_delete<supermap::KeyValueStorage<supermap::Key<30UL>,_supermap::MaybeRemovedValue<supermap::ByteArray<100UL>_>,_unsigned_long>_>_>
             .
             super__Head_base<0UL,_supermap::KeyValueStorage<supermap::Key<30UL>,_supermap::MaybeRemovedValue<supermap::ByteArray<100UL>_>,_unsigned_long>_*,_false>
             ._M_head_impl,key,value);
  return;
}

Assistant:

void add(const Key &key, Value &&value) override {
        nestedStorages_[getShardIdForKey(key)]->add(key, std::move(value));
    }